

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportLogging(TranslateToFuzzReader *this)

{
  string_view target;
  value_type *pvVar1;
  mapped_type *pmVar2;
  Call *pCVar3;
  initializer_list<wasm::Expression_*> __l;
  Type local_58;
  Type type;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_48;
  allocator_type local_29;
  
  pvVar1 = Random::pick<std::vector<wasm::Type,std::allocator<wasm::Type>>>
                     (&this->random,&this->loggableTypes);
  local_58.id = pvVar1->id;
  pmVar2 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->logImportNames,&local_58);
  target = (pmVar2->super_IString).str;
  type.id = (uintptr_t)make(this,local_58);
  __l._M_len = 1;
  __l._M_array = (iterator)&type;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_48,__l,&local_29);
  pCVar3 = Builder::makeCall(&this->builder,(Name)target,&local_48,(Type)0x0,false);
  if (local_48.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Expression *)pCVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportLogging() {
  auto type = getLoggableType();
  return builder.makeCall(logImportNames[type], {make(type)}, Type::none);
}